

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  bool local_1;
  
  jVar1 = storage_kind(in_RDI);
  this_00 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
            (ulong)(byte)(jVar1 - empty_object);
  switch(this_00) {
  case (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0:
  case (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x9:
    local_1 = true;
    break;
  default:
    local_1 = false;
    break;
  case (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x4:
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
              (in_stack_ffffffffffffffd0);
    json_const_reference_storage::value((json_const_reference_storage *)0x28d6fd);
    local_1 = is_object(this_00);
    break;
  case (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x5:
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffffd0);
    json_reference_storage::value((json_reference_storage *)0x28d728);
    local_1 = is_object(this_00);
  }
  return local_1;
}

Assistant:

bool is_object() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::empty_object:
                case json_storage_kind::object:
                    return true;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().is_object();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_object();
                default:
                    return false;
            }
        }